

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::str_format_internal::anon_unknown_3::ArgContext::Bind
          (ArgContext *this,UnboundConversion *unbound,BoundConversion *bound)

{
  bool bVar1;
  Flags f;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  int *piVar5;
  size_type in_R8;
  Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> pack;
  Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> pack_00;
  int local_58;
  int local_54;
  int precision;
  pointer local_48;
  byte local_39;
  int local_38;
  int iStack_34;
  bool force_left;
  int width;
  int arg_position;
  FormatArgImpl *arg;
  BoundConversion *bound_local;
  UnboundConversion *unbound_local;
  ArgContext *this_local;
  
  _width = (reference)0x0;
  iStack_34 = unbound->arg_position;
  iVar2 = iStack_34 + -1;
  arg = (FormatArgImpl *)bound;
  bound_local = (BoundConversion *)unbound;
  unbound_local = (UnboundConversion *)this;
  sVar4 = Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl>::size(&this->pack_);
  if ((ulong)(long)iVar2 < sVar4) {
    _width = Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl>::operator[]
                       (&this->pack_,(long)(iStack_34 + -1));
    if (bound_local->field_0xc == '\0') {
      FormatConversionSpecImplFriend::SetFlags
                (bound_local->field_0xc,(FormatConversionSpecImpl *)arg);
      FormatConversionSpecImplFriend::SetWidth(-1,(FormatConversionSpecImpl *)arg);
      FormatConversionSpecImplFriend::SetPrecision(-1,(FormatConversionSpecImpl *)arg);
    }
    else {
      local_38 = UnboundConversion::InputValue::value
                           ((InputValue *)&(bound_local->super_FormatConversionSpecImpl).width_);
      local_39 = 0;
      bVar1 = UnboundConversion::InputValue::is_from_arg
                        ((InputValue *)&(bound_local->super_FormatConversionSpecImpl).width_);
      if (bVar1) {
        uVar3 = UnboundConversion::InputValue::get_from_arg
                          ((InputValue *)&(bound_local->super_FormatConversionSpecImpl).width_);
        _precision = (this->pack_).ptr_;
        local_48 = (pointer)(this->pack_).len_;
        pack.len_ = in_R8;
        pack.ptr_ = local_48;
        bVar1 = BindFromPosition((anon_unknown_3 *)(ulong)uVar3,(int)&local_38,(int *)_precision,
                                 pack);
        if (!bVar1) {
          return false;
        }
        if (local_38 < 0) {
          local_39 = 1;
          local_54 = std::numeric_limits<int>::max();
          local_54 = -local_54;
          piVar5 = std::max<int>(&local_38,&local_54);
          local_38 = -*piVar5;
        }
      }
      local_58 = UnboundConversion::InputValue::value
                           ((InputValue *)&(bound_local->super_FormatConversionSpecImpl).precision_)
      ;
      bVar1 = UnboundConversion::InputValue::is_from_arg
                        ((InputValue *)&(bound_local->super_FormatConversionSpecImpl).precision_);
      if (bVar1) {
        uVar3 = UnboundConversion::InputValue::get_from_arg
                          ((InputValue *)&(bound_local->super_FormatConversionSpecImpl).precision_);
        pack_00.len_ = in_R8;
        pack_00.ptr_ = (pointer)(this->pack_).len_;
        bVar1 = BindFromPosition((anon_unknown_3 *)(ulong)uVar3,(int)&local_58,
                                 (int *)(this->pack_).ptr_,pack_00);
        if (!bVar1) {
          return false;
        }
      }
      FormatConversionSpecImplFriend::SetWidth(local_38,(FormatConversionSpecImpl *)arg);
      FormatConversionSpecImplFriend::SetPrecision(local_58,(FormatConversionSpecImpl *)arg);
      if ((local_39 & 1) == 0) {
        FormatConversionSpecImplFriend::SetFlags
                  (bound_local->field_0xc,(FormatConversionSpecImpl *)arg);
      }
      else {
        f = operator|(bound_local->field_0xc,kLeft);
        FormatConversionSpecImplFriend::SetFlags(f,(FormatConversionSpecImpl *)arg);
      }
      FormatConversionSpecImplFriend::SetLengthMod
                (bound_local->field_0xd,(FormatConversionSpecImpl *)arg);
    }
    FormatConversionSpecImplFriend::SetConversionChar
              (bound_local->field_0xe,(FormatConversionSpecImpl *)arg);
    BoundConversion::set_arg((BoundConversion *)arg,_width);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool ArgContext::Bind(const UnboundConversion* unbound,
                             BoundConversion* bound) {
  const FormatArgImpl* arg = nullptr;
  int arg_position = unbound->arg_position;
  if (static_cast<size_t>(arg_position - 1) >= pack_.size()) return false;
  arg = &pack_[static_cast<size_t>(arg_position - 1)];  // 1-based

  if (unbound->flags != Flags::kBasic) {
    int width = unbound->width.value();
    bool force_left = false;
    if (unbound->width.is_from_arg()) {
      if (!BindFromPosition(unbound->width.get_from_arg(), &width, pack_))
        return false;
      if (width < 0) {
        // "A negative field width is taken as a '-' flag followed by a
        // positive field width."
        force_left = true;
        // Make sure we don't overflow the width when negating it.
        width = -std::max(width, -std::numeric_limits<int>::max());
      }
    }

    int precision = unbound->precision.value();
    if (unbound->precision.is_from_arg()) {
      if (!BindFromPosition(unbound->precision.get_from_arg(), &precision,
                            pack_))
        return false;
    }

    FormatConversionSpecImplFriend::SetWidth(width, bound);
    FormatConversionSpecImplFriend::SetPrecision(precision, bound);

    if (force_left) {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags | Flags::kLeft,
                                               bound);
    } else {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    }

    FormatConversionSpecImplFriend::SetLengthMod(unbound->length_mod, bound);
  } else {
    FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    FormatConversionSpecImplFriend::SetWidth(-1, bound);
    FormatConversionSpecImplFriend::SetPrecision(-1, bound);
  }
  FormatConversionSpecImplFriend::SetConversionChar(unbound->conv, bound);
  bound->set_arg(arg);
  return true;
}